

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

double __thiscall
ON_Xform::GetSurfaceNormalXformKeepLengthAndOrientation(ON_Xform *this,ON_Xform *N_xform)

{
  bool bVar1;
  int __x;
  ON_Xform *__x_00;
  double extraout_XMM0_Qa;
  double dVar2;
  ON_Xform local_2e0;
  ON_Xform local_260;
  ON_Xform local_1e0;
  ON_Xform local_160;
  int local_dc;
  undefined1 local_d8 [4];
  int is_similarity;
  ON_Xform rotation;
  double scale;
  ON_3dVector translation;
  double tol;
  double det;
  double pivot;
  ON_Xform *N_xform_local;
  ON_Xform *this_local;
  
  pivot = (double)N_xform;
  N_xform_local = this;
  memcpy(N_xform,this,0x80);
  Linearize((ON_Xform *)pivot);
  det = 0.0;
  __x_00 = (ON_Xform *)Determinant((ON_Xform *)pivot,&det);
  translation.z = 3.308722450213671e-24;
  if (((ABS((double)__x_00) <= 3.308722450213671e-24) ||
      (1.0 <= ABS((double)__x_00) * 3.308722450213671e-24)) ||
     (ABS(det) <= ABS((double)__x_00) * 2.220446049250313e-16)) {
    this_local = (ON_Xform *)0x0;
  }
  else {
    scale = ON_3dVector::NanVector.x;
    translation.x = ON_3dVector::NanVector.y;
    translation.y = ON_3dVector::NanVector.z;
    rotation.m_xform[3][3] = ON_DBL_QNAN;
    memcpy(local_d8,&Nan,0x80);
    local_dc = DecomposeSimilarity((ON_Xform *)pivot,(ON_3dVector *)&scale,rotation.m_xform[3] + 3,
                                   (ON_Xform *)local_d8,2.3283064365386963e-10);
    this_local = __x_00;
    if (local_dc == 0) {
      bVar1 = Invert((ON_Xform *)pivot,(double *)0x0);
      if (bVar1) {
        Linearize((ON_Xform *)pivot);
        dVar2 = pivot;
        Transpose((ON_Xform *)pivot);
        __x = SUB84(dVar2,0);
        std::abs(__x);
        std::abs(__x);
        if (1.490116119385e-08 < extraout_XMM0_Qa) {
          dVar2 = pow((double)__x_00,-0.3333333333333333);
          ON_Xform(&local_2e0,dVar2);
          operator*(&local_260,&local_2e0,(ON_Xform *)pivot);
          memcpy((void *)pivot,&local_260,0x80);
        }
      }
      else {
        this_local = (ON_Xform *)0x0;
      }
    }
    else {
      memcpy((void *)pivot,local_d8,0x80);
      if ((double)__x_00 < 0.0) {
        ON_Xform(&local_1e0,-1.0);
        operator*(&local_160,&local_1e0,(ON_Xform *)pivot);
        memcpy((void *)pivot,&local_160,0x80);
      }
    }
  }
  return (double)this_local;
}

Assistant:

double ON_Xform::GetSurfaceNormalXformKeepLengthAndOrientation(ON_Xform& N_xform) const
{
  N_xform = *this;
  N_xform.Linearize();
  double pivot = 0;
  double det = N_xform.Determinant(&pivot);

  double tol = ON_SQRT_EPSILON * ON_SQRT_EPSILON * ON_SQRT_EPSILON;
  if (fabs(det) <= tol || fabs(det) * tol >= 1.0 || fabs(pivot) <= ON_EPSILON * fabs(det))
    return 0.;

  ON_3dVector translation{ ON_3dVector::NanVector };
  double scale{ ON_DBL_QNAN };
  ON_Xform rotation{ ON_Xform::Nan };
  const int is_similarity = N_xform.DecomposeSimilarity(translation, scale, rotation, ON_ZERO_TOLERANCE);
  // If it's a uniform scale, handle it, otherwise need to get the inverse.
  if (is_similarity != 0)
  {
    N_xform = rotation;
    if (det < 0)
    {
      N_xform = ON_Xform(-1.) * N_xform;
    }
    return det;
  }

  if (!N_xform.Invert()) return 0.;
  N_xform.Linearize();
  N_xform.Transpose();
  if (abs(abs(det) - 1) > ON_SQRT_EPSILON)
  {
    N_xform = ON_Xform(pow(det, -1. / 3.)) * N_xform;
  }

  return det;
}